

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void iterator_suite::test_const_iterator(void)

{
  ulong uVar1;
  basic_iterator<const_int> first_end;
  bool bVar2;
  reference piVar3;
  ulong uVar4;
  initializer_list<int> __l;
  basic_iterator<const_int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  allocator_type local_81;
  vector<int,_std::allocator<int>_> local_80;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  iterator_type local_58;
  circular_view<int,_18446744073709551615UL> local_48;
  type local_28 [6];
  
  local_48.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_48.member.cap = 4;
  local_48.member.size = 0;
  local_48.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_48,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_48);
  *piVar3 = 0xb;
  local_58.current = local_48.member.cap * 2;
  if ((local_58.current & local_48.member.cap * 2 - 1) == 0) {
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(local_48.member.next - local_48.member.size & local_58.current - 1);
    local_58.current = local_58.current - 1 & local_48.member.next;
  }
  else {
    local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_48.member.next - local_48.member.size) % local_58.current);
    local_58.current = local_48.member.next % local_58.current;
  }
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_48;
  local_58.parent = &local_48;
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&local_80,&local_58);
  boost::detail::test_impl
            ("span.cbegin() != span.cend()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x28c,"void iterator_suite::test_const_iterator()",!bVar2);
  local_58.parent = (view_pointer)CONCAT44(local_58.parent._4_4_,0xb);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l,&local_81);
  uVar1 = local_48.member.cap * 2;
  if ((uVar1 & local_48.member.cap * 2 - 1) == 0) {
    uVar4 = local_48.member.next - local_48.member.size & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_48.member.next;
  }
  else {
    uVar4 = (local_48.member.next - local_48.member.size) % uVar1;
    sStack_60 = local_48.member.next % uVar1;
  }
  first_end.current = sStack_60;
  first_end.parent = &local_48;
  first_begin.current = uVar4;
  first_begin.parent = &local_48;
  local_68 = &local_48;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x290,"void iterator_suite::test_const_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_const_iterator()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    BOOST_TEST(span.cbegin() != span.cend());
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.cbegin(), span.cend(),
                          expect.begin(), expect.end());
    }
}